

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O1

Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
* __thiscall
CTxMemPool::CalculateChunksForRBF
          (Result<std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
           *__return_storage_ptr__,CTxMemPool *this,CAmount replacement_fees,
          int64_t replacement_vsize,setEntries *direct_conflicts,setEntries *all_conflicts)

{
  undefined8 *puVar1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  FeeFrac *pFVar4;
  pointer pFVar5;
  int64_t iVar6;
  _Rb_tree_node_base *p_Var7;
  const_iterator cVar8;
  _Base_ptr p_Var9;
  int iVar10;
  long lVar11;
  long lVar12;
  FeeFrac *pFVar13;
  ulong uVar14;
  pointer pFVar15;
  _Rb_tree_header *p_Var16;
  setEntries *__range1;
  long in_FS_OFFSET;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  vector<FeeFrac,_std::allocator<FeeFrac>_> new_chunks;
  FeeFrac package;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  err_string;
  pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>
  local_148;
  vector<FeeFrac,_std::allocator<FeeFrac>_> local_118;
  CAmount local_100;
  vector<FeeFrac,_std::allocator<FeeFrac>_> local_f8;
  FeeFrac local_e0;
  FeeFrac local_d0;
  FeeFrac *local_c0;
  long local_b8;
  FeeFrac local_b0;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined8 uStack_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_60;
  bool local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_100 = replacement_fees;
  CheckConflictTopology_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_60,this,direct_conflicts);
  if (local_40 == true) {
    local_c0 = &local_b0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_60._M_value._M_dataplus._M_p,
               (pointer)(local_60._M_value._M_string_length +
                        (long)local_60._M_value._M_dataplus._M_p));
    local_a0 = &local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,local_c0,(long)&local_c0->fee + local_b8);
    local_80 = &local_70;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_c0,(long)&local_c0->fee + local_b8);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
                     .
                     super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                     .
                     super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                     .
                     super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                     .
                     super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                     .
                     super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
      .
      super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
      .
      super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
      .
      super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
      .
      super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
      .
      super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
         = puVar1;
    if (local_a0 == &local_90) {
      *puVar1 = CONCAT71(uStack_8f,local_90);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
               .
               super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
               .
               super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
               .
               super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
               .
               super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
               .
               super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
       + 0x18) = uStack_88;
    }
    else {
      *(undefined1 **)
       &(__return_storage_ptr__->m_variant).
        super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
        .
        super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
        .
        super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
        .
        super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
        .
        super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
        .
        super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
           = local_a0;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
                        .
                        super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                        .
                        super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                        .
                        super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                        .
                        super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                        .
                        super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                + 0x10) = CONCAT71(uStack_8f,local_90);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
             .
             super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
     + 8) = local_98;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
                     .
                     super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                     .
                     super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                     .
                     super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                     .
                     super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                     .
                     super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             + 0x30);
    *(undefined8 **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
             .
             super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
     + 0x20) = puVar1;
    if (local_80 == &local_70) {
      *puVar1 = CONCAT71(uStack_6f,local_70);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
               .
               super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
               .
               super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
               .
               super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
               .
               super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
               .
               super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
       + 0x38) = uStack_68;
    }
    else {
      *(undefined1 **)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
               .
               super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
               .
               super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
               .
               super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
               .
               super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
               .
               super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
       + 0x20) = local_80;
      *(ulong *)((long)&(__return_storage_ptr__->m_variant).
                        super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
                        .
                        super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                        .
                        super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                        .
                        super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                        .
                        super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                        .
                        super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
                + 0x30) = CONCAT71(uStack_6f,local_70);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
             .
             super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
     + 0x28) = local_78;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
             .
             super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
     + 0x40) = '\0';
    local_70 = 0;
    local_78 = 0;
    local_90 = 0;
    local_98 = 0;
    local_a0 = &local_90;
    local_80 = &local_70;
    if (local_c0 == &local_b0) goto LAB_003dd562;
    uVar14 = local_b0.fee + 1;
    pFVar15 = local_c0;
  }
  else {
    local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.super__Vector_impl_data.
    _M_start = (FeeFrac *)0x0;
    local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.super__Vector_impl_data.
    _M_finish = (FeeFrac *)0x0;
    local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (FeeFrac *)0x0;
    p_Var2 = &(all_conflicts->_M_t)._M_impl.super__Rb_tree_header;
    p_Var7 = (all_conflicts->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    pFVar13 = local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
              super__Vector_impl_data._M_start;
    pFVar4 = local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
           super__Vector_impl_data._M_start = pFVar13,
          local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
          super__Vector_impl_data._M_finish = pFVar4, (_Rb_tree_header *)p_Var7 != p_Var2) {
      lVar3 = *(long *)(p_Var7 + 1);
      if (*(ulong *)(lVar3 + 200) < 2) {
        pFVar15 = *(pointer *)(lVar3 + 0xa8);
        iVar6 = GetVirtualTransactionSize
                          ((long)*(int *)(lVar3 + 0x78),*(int64_t *)(lVar3 + 0xa0),nBytesPerSigOp);
        iVar10 = (int)iVar6;
        local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)CONCAT44(local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>.
                               _M_impl.super__Vector_impl_data._M_finish._4_4_,iVar10);
        local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
        super__Vector_impl_data._M_start = pFVar15;
        if (*(ulong *)(lVar3 + 0xe0) < 2) {
          if (local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_realloc_insert<FeeFrac&>
                      ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_118,
                       (iterator)
                       local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                       super__Vector_impl_data._M_finish,(FeeFrac *)&local_f8);
          }
          else {
LAB_003dd290:
            uVar17 = local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                     super__Vector_impl_data._M_start._0_4_;
            uVar18 = local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                     super__Vector_impl_data._M_start._4_4_;
            iVar10 = (int)local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                          super__Vector_impl_data._M_finish;
            uVar19 = local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                     super__Vector_impl_data._M_finish._4_4_;
LAB_003dd295:
            *(undefined4 *)
             &(local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
               super__Vector_impl_data._M_finish)->fee = uVar17;
            *(undefined4 *)
             ((long)&(local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                      super__Vector_impl_data._M_finish)->fee + 4) = uVar18;
            (local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish)->size = iVar10;
            *(undefined4 *)
             &(local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
               super__Vector_impl_data._M_finish)->field_0xc = uVar19;
            local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        else {
          local_d0.fee = *(long *)(lVar3 + 0xf0);
          local_d0.size = *(int *)(lVar3 + 0xe8);
          lVar11 = SUB168(SEXT816((long)local_d0.size) * SEXT816((long)pFVar15),8);
          lVar12 = SUB168(SEXT816(local_d0.fee) * SEXT816((long)iVar10),8);
          uVar14 = (ulong)((ulong)(local_d0.fee * iVar10) <
                          (ulong)((long)local_d0.size * (long)pFVar15));
          lVar3 = lVar12 - lVar11;
          if ((SBORROW8(lVar12,lVar11) != SBORROW8(lVar3,uVar14)) == (long)(lVar3 - uVar14) < 0) {
            local_e0.fee = local_d0.fee - (long)pFVar15;
            local_e0.size = local_d0.size - iVar10;
            if (local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<FeeFrac,_std::allocator<FeeFrac>_>::_M_realloc_insert<FeeFrac>
                        (&local_118,
                         (iterator)
                         local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_e0);
            }
            else {
              (local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
               super__Vector_impl_data._M_finish)->fee = local_e0.fee;
              *(ulong *)&(local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                          super__Vector_impl_data._M_finish)->size =
                   CONCAT44(local_e0._12_4_,local_e0.size);
              local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_003dd290;
            pFVar13 = (FeeFrac *)&local_f8;
          }
          else {
            if (local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              local_d0.fee._4_4_ = (undefined4)((ulong)local_d0.fee >> 0x20);
              uVar17 = (undefined4)local_d0.fee;
              uVar18 = local_d0.fee._4_4_;
              iVar10 = local_d0.size;
              uVar19 = local_d0._12_4_;
              goto LAB_003dd295;
            }
            pFVar13 = &local_d0;
          }
          std::vector<FeeFrac,std::allocator<FeeFrac>>::_M_realloc_insert<FeeFrac&>
                    ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_118,
                     (iterator)
                     local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                     super__Vector_impl_data._M_finish,pFVar13);
        }
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      pFVar13 = local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                super__Vector_impl_data._M_start;
      pFVar4 = local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    if (pFVar13 != pFVar4) {
      uVar14 = (long)pFVar4 - (long)pFVar13 >> 4;
      lVar3 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<FeeFrac*,std::vector<FeeFrac,std::allocator<FeeFrac>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
                (pFVar13,pFVar4,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<FeeFrac*,std::vector<FeeFrac,std::allocator<FeeFrac>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
                (pFVar13,pFVar4);
    }
    local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    p_Var9 = (direct_conflicts->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var16 = &(direct_conflicts->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 != p_Var16) {
      do {
        if (*(long *)(*(long *)(p_Var9 + 1) + 0x38) != 0) {
          lVar3 = *(long *)(*(long *)(*(long *)(p_Var9 + 1) + 0x28) + 0x20);
          local_d0.fee = lVar3;
          cVar8 = std::_Rb_tree<$270907ca$>::find(&all_conflicts->_M_t,(key_type *)&local_d0);
          if ((_Rb_tree_header *)cVar8._M_node == p_Var2) {
            local_d0.fee = *(int64_t *)(lVar3 + 0xa8);
            iVar6 = GetVirtualTransactionSize
                              ((long)*(int *)(lVar3 + 0x78),*(int64_t *)(lVar3 + 0xa0),
                               nBytesPerSigOp);
            local_e0.fee = CONCAT44(local_e0.fee._4_4_,(int)iVar6);
            std::vector<FeeFrac,std::allocator<FeeFrac>>::emplace_back<long,int>
                      ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_f8,&local_d0.fee,
                       (int *)&local_e0);
          }
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var16);
    }
    local_d0.fee = CONCAT44(local_d0.fee._4_4_,(int)replacement_vsize);
    std::vector<FeeFrac,std::allocator<FeeFrac>>::emplace_back<long&,int>
              ((vector<FeeFrac,std::allocator<FeeFrac>> *)&local_f8,&local_100,(int *)&local_d0);
    pFVar5 = local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pFVar15 = local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      uVar14 = (long)local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                     super__Vector_impl_data._M_start >> 4;
      lVar3 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<FeeFrac*,std::vector<FeeFrac,std::allocator<FeeFrac>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
                (local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<FeeFrac*,std::vector<FeeFrac,std::allocator<FeeFrac>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
                (pFVar15,pFVar5);
    }
    std::
    pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>
    ::
    pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>_&,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_&,_true>
              (&local_148,&local_118,&local_f8);
    *(pointer *)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
      .
      super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
      .
      super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
      .
      super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
      .
      super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
      .
      super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
         = local_148.first.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
           super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
             .
             super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
     + 8) = local_148.first.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
            super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
             .
             super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
     + 0x10) = local_148.first.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    *(pointer *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
             .
             super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
     + 0x18) = local_148.second.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
               super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
             .
             super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
     + 0x20) = local_148.second.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
             .
             super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
     + 0x28) = local_148.second.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_std::pair<std::vector<FeeFrac,_std::allocator<FeeFrac>_>,_std::vector<FeeFrac,_std::allocator<FeeFrac>_>_>_>
             .
             super__Move_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_assign_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Move_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Copy_ctor_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
             .
             super__Variant_storage_alias<bilingual_str,_std::pair<std::vector<FeeFrac>,_std::vector<FeeFrac>_>_>
     + 0x40) = '\x01';
    local_148.second.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.second.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.second.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.first.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.first.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.first.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    if (local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
        super__Vector_impl_data._M_start == (FeeFrac *)0x0) goto LAB_003dd562;
    uVar14 = (long)local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
                   super__Vector_impl_data._M_start;
    pFVar15 = local_118.super__Vector_base<FeeFrac,_std::allocator<FeeFrac>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  operator_delete(pFVar15,uVar14);
LAB_003dd562:
  if ((local_40 == true) &&
     (local_40 = false,
     local_60._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_60._M_value + 0x10))) {
    operator_delete((void *)local_60._M_value._M_dataplus._M_p,local_60._16_8_ + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<std::pair<std::vector<FeeFrac>, std::vector<FeeFrac>>> CTxMemPool::CalculateChunksForRBF(CAmount replacement_fees, int64_t replacement_vsize, const setEntries& direct_conflicts, const setEntries& all_conflicts)
{
    Assume(replacement_vsize > 0);

    auto err_string{CheckConflictTopology(direct_conflicts)};
    if (err_string.has_value()) {
        // Unsupported topology for calculating a feerate diagram
        return util::Error{Untranslated(err_string.value())};
    }

    // new diagram will have chunks that consist of each ancestor of
    // direct_conflicts that is at its own fee/size, along with the replacement
    // tx/package at its own fee/size

    // old diagram will consist of the ancestors and descendants of each element of
    // all_conflicts.  every such transaction will either be at its own feerate (followed
    // by any descendant at its own feerate), or as a single chunk at the descendant's
    // ancestor feerate.

    std::vector<FeeFrac> old_chunks;
    // Step 1: build the old diagram.

    // The above clusters are all trivially linearized;
    // they have a strict topology of 1 or two connected transactions.

    // OLD: Compute existing chunks from all affected clusters
    for (auto txiter : all_conflicts) {
        // Does this transaction have descendants?
        if (txiter->GetCountWithDescendants() > 1) {
            // Consider this tx when we consider the descendant.
            continue;
        }
        // Does this transaction have ancestors?
        FeeFrac individual{txiter->GetModifiedFee(), txiter->GetTxSize()};
        if (txiter->GetCountWithAncestors() > 1) {
            // We'll add chunks for either the ancestor by itself and this tx
            // by itself, or for a combined package.
            FeeFrac package{txiter->GetModFeesWithAncestors(), static_cast<int32_t>(txiter->GetSizeWithAncestors())};
            if (individual >> package) {
                // The individual feerate is higher than the package, and
                // therefore higher than the parent's fee. Chunk these
                // together.
                old_chunks.emplace_back(package);
            } else {
                // Add two points, one for the parent and one for this child.
                old_chunks.emplace_back(package - individual);
                old_chunks.emplace_back(individual);
            }
        } else {
            old_chunks.emplace_back(individual);
        }
    }

    // No topology restrictions post-chunking; sort
    std::sort(old_chunks.begin(), old_chunks.end(), std::greater());

    std::vector<FeeFrac> new_chunks;

    /* Step 2: build the NEW diagram
     * CON = Conflicts of proposed chunk
     * CNK = Proposed chunk
     * NEW = OLD - CON + CNK: New diagram includes all chunks in OLD, minus
     * the conflicts, plus the proposed chunk
     */

    // OLD - CON: Add any parents of direct conflicts that are not conflicted themselves
    for (auto direct_conflict : direct_conflicts) {
        // If a direct conflict has an ancestor that is not in all_conflicts,
        // it can be affected by the replacement of the child.
        if (direct_conflict->GetMemPoolParentsConst().size() > 0) {
            // Grab the parent.
            const CTxMemPoolEntry& parent = direct_conflict->GetMemPoolParentsConst().begin()->get();
            if (!all_conflicts.count(mapTx.iterator_to(parent))) {
                // This transaction would be left over, so add to the NEW
                // diagram.
                new_chunks.emplace_back(parent.GetModifiedFee(), parent.GetTxSize());
            }
        }
    }
    // + CNK: Add the proposed chunk itself
    new_chunks.emplace_back(replacement_fees, int32_t(replacement_vsize));

    // No topology restrictions post-chunking; sort
    std::sort(new_chunks.begin(), new_chunks.end(), std::greater());
    return std::make_pair(old_chunks, new_chunks);
}